

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__lhs;
  bool bVar1;
  ostream *poVar2;
  rep rVar3;
  bool local_481;
  duration<long,_std::ratio<1L,_1000000000L>_> local_480;
  duration<long,_std::ratio<1L,_1000L>_> local_478;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_470;
  time_point end;
  time_point start;
  Identifier local_438;
  Identifier local_410;
  Identifier local_3e8;
  Identifier local_3c0;
  Identifier local_398;
  undefined1 local_370 [8];
  Context<char> context;
  char *grammar_path;
  char *input_path;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  byte local_1d;
  int local_1c;
  bool no_action;
  char **ppcStack_18;
  int worker_num;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  if (argc < 1) {
    argv_local._4_4_ = 1;
  }
  else {
    ppcStack_18 = argv;
    argv_local._0_4_ = argc;
    local_1c = atoi(argv[1]);
    local_481 = false;
    local_1d = local_481;
    if (2 < (int)argv_local) {
      __lhs = ppcStack_18[2];
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,"dry",&local_41);
      bVar1 = std::operator==(__lhs,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      local_1d = bVar1;
    }
    context.m_callbacks.
    super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_203be;
    Centaurus::Context<char>::Context((Context<char> *)local_370,"../../grammars/xml.cgr");
    if ((local_1d & 1) == 0) {
      Centaurus::Identifier::Identifier(&local_398,L"ElementBody");
      Centaurus::Context<char>::attach((Context<char> *)local_370,&local_398,parseElementBody);
      Centaurus::Identifier::~Identifier(&local_398);
      Centaurus::Identifier::Identifier(&local_3c0,L"Name");
      Centaurus::Context<char>::attach((Context<char> *)local_370,&local_3c0,parseName);
      Centaurus::Identifier::~Identifier(&local_3c0);
      Centaurus::Identifier::Identifier(&local_3e8,L"Value");
      Centaurus::Context<char>::attach((Context<char> *)local_370,&local_3e8,parseValue);
      Centaurus::Identifier::~Identifier(&local_3e8);
      Centaurus::Identifier::Identifier(&local_410,L"Attribute");
      Centaurus::Context<char>::attach((Context<char> *)local_370,&local_410,parseAttribute);
      Centaurus::Identifier::~Identifier(&local_410);
      Centaurus::Identifier::Identifier(&local_438,L"Content");
      Centaurus::Context<char>::attach((Context<char> *)local_370,&local_438,parseContent);
      Centaurus::Identifier::~Identifier(&local_438);
      Centaurus::Identifier::Identifier((Identifier *)&start,L"Element");
      Centaurus::Context<char>::attach((Context<char> *)local_370,(Identifier *)&start,parseElement)
      ;
      Centaurus::Identifier::~Identifier((Identifier *)&start);
    }
    end.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    Centaurus::Context<char>::parse((Context<char> *)local_370,"../../datasets/dblp.xml",local_1c);
    local_470.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
    poVar2 = std::operator<<(poVar2," ");
    local_480.__r = (rep)std::chrono::operator-(&local_470,&end);
    local_478.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_480);
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_478);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 0;
    Centaurus::Context<char>::~Context((Context<char> *)local_370);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[])
{
    if (argc < 1) return 1;
    int worker_num = std::atoi(argv[1]);
    bool no_action = argc >= 3 && argv[2] == std::string("dry");

    const char *input_path = "../../datasets/dblp.xml";
    const char *grammar_path = "../../grammars/xml.cgr";

    Context<char> context{grammar_path};

    if (!no_action) {
      context.attach(L"ElementBody", parseElementBody);
      context.attach(L"Name", parseName);
      context.attach(L"Value", parseValue);
      context.attach(L"Attribute", parseAttribute);
      context.attach(L"Content", parseContent);
      context.attach(L"Element", parseElement);
    }

    using namespace std::chrono;

    auto start = high_resolution_clock::now();;

    context.parse(input_path, worker_num);

    auto end = high_resolution_clock::now();;

    std::cout << worker_num << " " << duration_cast<milliseconds>(end - start).count() << std::endl;

    return 0;
}